

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

void ImageMipmaps(Image *image)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  int iVar7;
  int i;
  bool bVar8;
  Image imCopy;
  
  pvVar6 = image->data;
  if (((pvVar6 != (void *)0x0) && (iVar2 = image->width, iVar2 != 0)) &&
     (iVar3 = image->height, iVar3 != 0)) {
    iVar5 = image->format;
    iVar1 = GetPixelDataSize(iVar2,iVar3,iVar5);
    iVar7 = 0;
    while (iVar3 != 1 || iVar2 != 1) {
      iVar2 = iVar2 / 2;
      if (iVar2 < 2) {
        iVar2 = 1;
      }
      iVar3 = iVar3 / 2;
      if (iVar3 < 2) {
        iVar3 = 1;
      }
      iVar4 = GetPixelDataSize(iVar2,iVar3,iVar5);
      iVar1 = iVar1 + iVar4;
      iVar7 = iVar7 + 1;
    }
    iVar2 = iVar7 + 1;
    if (iVar2 <= image->mipmaps) {
      TraceLog(4,"IMAGE: Mipmaps already available");
      return;
    }
    pvVar6 = realloc(pvVar6,(long)iVar1);
    if (pvVar6 == (void *)0x0) {
      TraceLog(4,"IMAGE: Mipmaps required memory could not be allocated");
      pvVar6 = image->data;
    }
    else {
      image->data = pvVar6;
    }
    iVar3 = image->width;
    iVar5 = image->height;
    iVar4 = GetPixelDataSize(iVar3,iVar5,image->format);
    ImageCopy(*image);
    iVar1 = 1;
    while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
      pvVar6 = (void *)((long)pvVar6 + (long)iVar4);
      iVar3 = iVar3 / 2;
      iVar5 = iVar5 / 2;
      if (iVar3 < 2) {
        iVar3 = 1;
      }
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      iVar4 = GetPixelDataSize(iVar3,iVar5,image->format);
      if (image->mipmaps <= iVar1) {
        ImageResize(&imCopy,iVar3,iVar5);
        memcpy(pvVar6,imCopy.data,(long)iVar4);
      }
      iVar1 = iVar1 + 1;
    }
    free(imCopy.data);
    image->mipmaps = iVar2;
  }
  return;
}

Assistant:

void ImageMipmaps(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    int mipCount = 1;                   // Required mipmap levels count (including base level)
    int mipWidth = image->width;        // Base image width
    int mipHeight = image->height;      // Base image height
    int mipSize = GetPixelDataSize(mipWidth, mipHeight, image->format);  // Image data size (in bytes)

    // Count mipmap levels required
    while ((mipWidth != 1) || (mipHeight != 1))
    {
        if (mipWidth != 1) mipWidth /= 2;
        if (mipHeight != 1) mipHeight /= 2;

        // Security check for NPOT textures
        if (mipWidth < 1) mipWidth = 1;
        if (mipHeight < 1) mipHeight = 1;

        TRACELOGD("IMAGE: Next mipmap level: %i x %i - current size %i", mipWidth, mipHeight, mipSize);

        mipCount++;
        mipSize += GetPixelDataSize(mipWidth, mipHeight, image->format);       // Add mipmap size (in bytes)
    }

    if (image->mipmaps < mipCount)
    {
        void *temp = RL_REALLOC(image->data, mipSize);

        if (temp != NULL) image->data = temp;      // Assign new pointer (new size) to store mipmaps data
        else TRACELOG(LOG_WARNING, "IMAGE: Mipmaps required memory could not be allocated");

        // Pointer to allocated memory point where store next mipmap level data
        unsigned char *nextmip = image->data;

        mipWidth = image->width;
        mipHeight = image->height;
        mipSize = GetPixelDataSize(mipWidth, mipHeight, image->format);
        Image imCopy = ImageCopy(*image);

        for (int i = 1; i < mipCount; i++)
        {
            nextmip += mipSize;

            mipWidth /= 2;
            mipHeight /= 2;

            // Security check for NPOT textures
            if (mipWidth < 1) mipWidth = 1;
            if (mipHeight < 1) mipHeight = 1;

            mipSize = GetPixelDataSize(mipWidth, mipHeight, image->format);

            if (i < image->mipmaps) continue;

            TRACELOGD("IMAGE: Generating mipmap level: %i (%i x %i) - size: %i - offset: 0x%x", i, mipWidth, mipHeight, mipSize, nextmip);

            ImageResize(&imCopy, mipWidth, mipHeight); // Uses internally Mitchell cubic downscale filter

            memcpy(nextmip, imCopy.data, mipSize);
        }

        UnloadImage(imCopy);

        image->mipmaps = mipCount;
    }
    else TRACELOG(LOG_WARNING, "IMAGE: Mipmaps already available");
}